

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::Functions::ACos::ACos(ACos *this)

{
  allocator<char> local_61;
  string local_60;
  Interval local_40;
  Interval local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"acos",&local_61);
  local_28.m_hasNaN = false;
  local_28.m_lo = -1.0;
  local_28.m_hi = 1.0;
  local_40.m_hasNaN = false;
  local_40.m_lo._0_4_ = 0;
  local_40.m_lo._4_4_ = 0;
  local_40.m_hi._0_4_ = 0x54442d18;
  local_40.m_hi._4_4_ = 0x400921fb;
  ArcTrigFunc::ArcTrigFunc(&this->super_ArcTrigFunc,&local_60,deAcos,4096.0,&local_28,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_ArcTrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00c1d228;
  return;
}

Assistant:

ACos (void) : ArcTrigFunc("acos", deAcos, 4096.0,
							  Interval(-1.0, 1.0),
							  Interval(0.0, DE_PI_DOUBLE)) {}